

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O3

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  size_t sVar2;
  code *UNRECOVERED_JUMPTABLE_00;
  uchar *source;
  STRING_HANDLE handle;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  char proxy_basic [30];
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar8 = "NULL context in on_underlying_io_open_complete";
    iVar1 = 0xfc;
LAB_0010a65b:
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
               ,"on_underlying_io_open_complete",iVar1,1,pcVar8);
    return;
  }
  iVar1 = *context;
  if (iVar1 - 3U < 2) {
    (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
    return;
  }
  if (iVar1 == 1) {
    if (open_result == IO_OPEN_OK) {
      *(undefined4 *)context = 2;
      pcVar8 = *(char **)((long)context + 0x68);
      if (pcVar8 == (char *)0x0) {
LAB_0010a7ca:
        handle = (STRING_HANDLE)0x0;
      }
      else {
        sVar2 = strlen(pcVar8);
        uVar10 = (int)sVar2 + 1;
        pcVar3 = *(char **)((long)context + 0x70);
        if (pcVar3 != (char *)0x0) {
          sVar2 = strlen(pcVar3);
          uVar10 = uVar10 + (int)sVar2;
        }
        if ((int)uVar10 < 0) {
LAB_0010a7c2:
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          goto LAB_0010a7ca;
        }
        source = (uchar *)malloc((ulong)uVar10 + 1);
        if (source == (uchar *)0x0) goto LAB_0010a7c2;
        pcVar5 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar5 = pcVar3;
        }
        iVar1 = sprintf((char *)source,"%s:%s",pcVar8,pcVar5);
        if (iVar1 < 0) {
LAB_0010a7a8:
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          handle = (STRING_HANDLE)0x0;
        }
        else {
          handle = Azure_Base64_Encode_Bytes(source,(ulong)uVar10);
          if (handle == (STRING_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                         ,"on_underlying_io_open_complete",0x15a,1,
                         "Cannot Base64 encode auth string");
            }
            goto LAB_0010a7a8;
          }
        }
        free(source);
      }
      pcVar8 = *(char **)((long)context + 0x48);
      if ((pcVar8 == (char *)0x0) ||
         (handle == (STRING_HANDLE)0x0 && *(long *)((long)context + 0x68) != 0)) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                     ,"on_underlying_io_open_complete",0x16b,1,"Cannot create authorization header")
          ;
        }
        goto LAB_0010a9fd;
      }
      builtin_strncpy(proxy_basic + 0x10,"ation: Basic ",0xe);
      builtin_strncpy(proxy_basic,"\r\nProxy-authoriz",0x10);
      if (*(long *)((long)context + 0x68) == 0) {
        pcVar3 = "";
        bVar11 = true;
      }
      else {
        pcVar3 = STRING_c_str(handle);
        pcVar8 = *(char **)((long)context + 0x48);
        bVar11 = *(long *)((long)context + 0x68) == 0;
      }
      sVar2 = strlen(pcVar8);
      sVar4 = strlen(pcVar3);
      iVar1 = (int)sVar4 + (int)sVar2 * 2 + 0x27;
      if (bVar11) {
        iVar1 = (int)sVar4 + (int)sVar2 * 2 + 10;
      }
      if (iVar1 + 0x2a < 0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar8 = "Cannot encode the CONNECT request";
          iVar1 = 0x188;
LAB_0010a9a0:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                     ,"on_underlying_io_open_complete",iVar1,1,pcVar8);
        }
      }
      else {
        pcVar5 = (char *)malloc((ulong)(iVar1 + 0x2b));
        if (pcVar5 != (char *)0x0) {
          pcVar9 = proxy_basic;
          if (bVar11) {
            pcVar9 = "";
          }
          uVar10 = sprintf(pcVar5,"CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n",pcVar8,
                           (ulong)*(uint *)((long)context + 0x50),pcVar8,
                           (ulong)*(uint *)((long)context + 0x50),pcVar9,pcVar3);
          if ((int)uVar10 < 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar8 = "Cannot encode the CONNECT request";
              iVar1 = 0x1a4;
LAB_0010a9e0:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                         ,"on_underlying_io_open_complete",iVar1,1,pcVar8);
            }
LAB_0010a9eb:
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            iVar1 = xio_send(*(XIO_HANDLE *)((long)context + 0x78),pcVar5,(ulong)uVar10,
                             unchecked_on_send_complete,(void *)0x0);
            if (iVar1 != 0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar8 = "Could not send CONNECT request";
                iVar1 = 0x1ad;
                goto LAB_0010a9e0;
              }
              goto LAB_0010a9eb;
            }
          }
          free(pcVar5);
          goto LAB_0010a9fd;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar8 = "Cannot allocate memory for CONNECT request";
          iVar1 = 0x193;
          goto LAB_0010a9a0;
        }
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
LAB_0010a9fd:
      if (handle != (STRING_HANDLE)0x0) {
        STRING_delete(handle);
      }
      return;
    }
    if (open_result == IO_OPEN_CANCELLED) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                   ,"on_underlying_io_open_complete",0x11f,1,"Underlying IO open failed");
      }
      *(undefined4 *)context = 0;
      xio_close(*(XIO_HANDLE *)((long)context + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x28);
      uVar7 = *(undefined8 *)((long)context + 0x30);
      uVar6 = 3;
      goto LAB_0010a706;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar8 = "Underlying IO open failed";
      iVar1 = 0x119;
      goto LAB_0010a6db;
    }
  }
  else {
    if (iVar1 != 2) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar8 = "on_underlying_io_open_complete called in an unexpected state.";
      iVar1 = 0x104;
      goto LAB_0010a65b;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar8 = "Open complete called again by underlying IO.";
      iVar1 = 0x10f;
LAB_0010a6db:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                 ,"on_underlying_io_open_complete",iVar1,1,pcVar8);
    }
  }
  *(undefined4 *)context = 0;
  xio_close(*(XIO_HANDLE *)((long)context + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
  UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x28);
  uVar7 = *(undefined8 *)((long)context + 0x30);
  uVar6 = 2;
LAB_0010a706:
  (*UNRECOVERED_JUMPTABLE_00)(uVar7,uVar6);
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    if (context == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_081: [ on_underlying_io_open_complete called with NULL context shall do nothing. ]*/
        LogError("NULL context in on_underlying_io_open_complete");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)context;
        switch (http_proxy_io_instance->http_proxy_io_state)
        {
        default:
            LogError("on_underlying_io_open_complete called in an unexpected state.");
            break;

        case HTTP_PROXY_IO_STATE_CLOSING:
        case HTTP_PROXY_IO_STATE_OPEN:
            /* Codes_SRS_HTTP_PROXY_IO_01_077: [ When on_underlying_io_open_complete is called in after OPEN has completed, the on_io_error callback shall be triggered passing the on_io_error_context argument as context. ]*/
            http_proxy_io_instance->on_io_error(http_proxy_io_instance->on_io_error_context);
            break;

        case HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE:
            /* Codes_SRS_HTTP_PROXY_IO_01_076: [ When on_underlying_io_open_complete is called while waiting for the CONNECT reply, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
            LogError("Open complete called again by underlying IO.");
            indicate_open_complete_error_and_close(http_proxy_io_instance);
            break;

        case HTTP_PROXY_IO_STATE_OPENING_UNDERLYING_IO:
            switch (open_result)
            {
            default:
            case IO_OPEN_ERROR:
                /* Codes_SRS_HTTP_PROXY_IO_01_078: [ When on_underlying_io_open_complete is called with IO_OPEN_ERROR, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                LogError("Underlying IO open failed");
                indicate_open_complete_error_and_close(http_proxy_io_instance);
                break;

            case IO_OPEN_CANCELLED:
                /* Codes_SRS_HTTP_PROXY_IO_01_079: [ When on_underlying_io_open_complete is called with IO_OPEN_CANCELLED, the on_open_complete callback shall be triggered with IO_OPEN_CANCELLED, passing also the on_open_complete_context argument as context. ]*/
                LogError("Underlying IO open failed");
                http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSED;
                (void)xio_close(http_proxy_io_instance->underlying_io, NULL, NULL);
                http_proxy_io_instance->on_io_open_complete(http_proxy_io_instance->on_io_open_complete_context, IO_OPEN_CANCELLED);
                break;

            case IO_OPEN_OK:
            {
                STRING_HANDLE encoded_auth_string;

                /* Codes_SRS_HTTP_PROXY_IO_01_057: [ When on_underlying_io_open_complete is called, the http_proxy_io shall send the CONNECT request constructed per RFC 2817: ]*/
                http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE;

                if (http_proxy_io_instance->username != NULL)
                {
                    char* plain_auth_string_bytes;

                    /* Codes_SRS_HTTP_PROXY_IO_01_060: [ - The value of Proxy-Authorization shall be the constructed according to RFC 2617. ]*/
                    int plain_auth_string_length = (int)(strlen(http_proxy_io_instance->username)+1);
                    if (http_proxy_io_instance->password != NULL)
                    {
                        plain_auth_string_length += (int)strlen(http_proxy_io_instance->password);
                    }

                    if (plain_auth_string_length < 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        encoded_auth_string = NULL;
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    else
                    {
                        size_t malloc_size = safe_add_size_t((size_t)plain_auth_string_length, 1);
                        if (malloc_size == SIZE_MAX ||
                            (plain_auth_string_bytes = (char*)malloc(malloc_size)) == NULL)
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                            encoded_auth_string = NULL;
                            plain_auth_string_bytes = NULL;
                            indicate_open_complete_error_and_close(http_proxy_io_instance);
                        }
                        else
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_091: [ To receive authorization, the client sends the userid and password, separated by a single colon (":") character, within a base64 [7] encoded string in the credentials. ]*/
                            /* Codes_SRS_HTTP_PROXY_IO_01_092: [ A client MAY preemptively send the corresponding Authorization header with requests for resources in that space without receipt of another challenge from the server. ]*/
                            /* Codes_SRS_HTTP_PROXY_IO_01_093: [ Userids might be case sensitive. ]*/
                            if (sprintf(plain_auth_string_bytes, "%s:%s", http_proxy_io_instance->username, (http_proxy_io_instance->password == NULL) ? "" : http_proxy_io_instance->password) < 0)
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                encoded_auth_string = NULL;
                                indicate_open_complete_error_and_close(http_proxy_io_instance);
                            }
                            else
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_061: [ Encoding to Base64 shall be done by calling Azure_Base64_Encode_Bytes. ]*/
                                encoded_auth_string = Azure_Base64_Encode_Bytes((const unsigned char*)plain_auth_string_bytes, plain_auth_string_length);
                                if (encoded_auth_string == NULL)
                                {
                                    /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                    LogError("Cannot Base64 encode auth string");
                                    indicate_open_complete_error_and_close(http_proxy_io_instance);
                                }
                            }

                            free(plain_auth_string_bytes);
                        }
                    }
                }
                else
                {
                    encoded_auth_string = NULL;
                }

                if (http_proxy_io_instance->hostname == NULL ||
                    (http_proxy_io_instance->username != NULL && encoded_auth_string == NULL))
                {
                    LogError("Cannot create authorization header");
                }
                else
                {
                    int connect_request_length;
                    const char* auth_string_payload;
                    /* Codes_SRS_HTTP_PROXY_IO_01_075: [ The Request-URI portion of the Request-Line is always an 'authority' as defined by URI Generic Syntax [2], which is to say the host name and port number destination of the requested connection separated by a colon: ]*/
                    const char request_format[] = "CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n";
                    const char proxy_basic[] = "\r\nProxy-authorization: Basic ";
                    if (http_proxy_io_instance->username != NULL)
                    {
                        auth_string_payload = STRING_c_str(encoded_auth_string);
                    }
                    else
                    {
                        auth_string_payload = "";
                    }

                    /* Codes_SRS_HTTP_PROXY_IO_01_059: [ - If username and password have been specified in the arguments passed to http_proxy_io_create, then the header Proxy-Authorization shall be added to the request. ]*/

                    connect_request_length = (int)(strlen(request_format)+(strlen(http_proxy_io_instance->hostname)*2)+strlen(auth_string_payload)+10);
                    if (http_proxy_io_instance->username != NULL)
                    {
                        connect_request_length += (int)strlen(proxy_basic);
                    }

                    if (connect_request_length < 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        LogError("Cannot encode the CONNECT request");
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    else
                    {
                        char* connect_request;
                        size_t malloc_size = safe_add_size_t((size_t)connect_request_length, 1);
                        if (malloc_size == SIZE_MAX ||
                            (connect_request = (char*)malloc(malloc_size)) == NULL)
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                            LogError("Cannot allocate memory for CONNECT request");
                            indicate_open_complete_error_and_close(http_proxy_io_instance);
                        }
                        else
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_059: [ - If username and password have been specified in the arguments passed to http_proxy_io_create, then the header Proxy-Authorization shall be added to the request. ]*/
                            connect_request_length = sprintf(connect_request, request_format,
                                http_proxy_io_instance->hostname,
                                http_proxy_io_instance->port,
                                http_proxy_io_instance->hostname,
                                http_proxy_io_instance->port,
                                (http_proxy_io_instance->username != NULL) ? proxy_basic : "",
                                auth_string_payload);

                            if (connect_request_length < 0)
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                LogError("Cannot encode the CONNECT request");
                                indicate_open_complete_error_and_close(http_proxy_io_instance);
                            }
                            else
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_063: [ The request shall be sent by calling xio_send and passing NULL as on_send_complete callback. ]*/
                                if (xio_send(http_proxy_io_instance->underlying_io, connect_request, connect_request_length, unchecked_on_send_complete, NULL) != 0)
                                {
                                    /* Codes_SRS_HTTP_PROXY_IO_01_064: [ If xio_send fails, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                    LogError("Could not send CONNECT request");
                                    indicate_open_complete_error_and_close(http_proxy_io_instance);
                                }
                            }

                            free(connect_request);
                        }
                    }
                }

                if (encoded_auth_string != NULL)
                {
                    STRING_delete(encoded_auth_string);
                }

                break;
            }
            }

            break;
        }
    }
}